

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,size_t *unconsumed)

{
  char cVar1;
  int error_number;
  archive_string *paVar2;
  long lVar3;
  char *pcVar4;
  void *pvVar5;
  archive_string *paVar6;
  size_t sVar7;
  int64_t iVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  int64_t iStack_60;
  size_t local_58;
  archive_read *local_50;
  long local_48;
  archive_string *local_40;
  long *local_38;
  
  local_40 = &tar->line;
  local_48 = *remaining;
  local_50 = a;
  local_38 = remaining;
  do {
    if (99 < local_48) {
      local_48 = 100;
    }
    tar_flush_unconsumed(a,unconsumed);
    pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
    sVar7 = local_58;
    if ((long)local_58 < 1) {
      return -0x1e;
    }
    pvVar5 = memchr(pcVar4,10,local_58);
    if (pvVar5 == (void *)0x0) {
      bVar11 = true;
      sVar10 = 0;
      while( true ) {
        paVar2 = local_40;
        *unconsumed = sVar7;
        if (local_48 < (long)(sVar7 + sVar10)) goto LAB_00372426;
        paVar6 = archive_string_ensure(local_40,sVar7 + sVar10);
        if (paVar6 == (archive_string *)0x0) {
          pcVar4 = "Can\'t allocate working buffer";
          error_number = 0xc;
          goto LAB_0037243a;
        }
        memcpy(paVar2->s + sVar10,pcVar4,local_58);
        a = local_50;
        tar_flush_unconsumed(local_50,unconsumed);
        sVar10 = sVar10 + local_58;
        if (!bVar11) break;
        pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
        sVar7 = local_58;
        if ((long)local_58 < 1) {
          return -0x1e;
        }
        pvVar5 = memchr(pcVar4,10,local_58);
        bVar11 = pvVar5 == (void *)0x0;
        if (!bVar11) {
          sVar7 = (long)pvVar5 + (1 - (long)pcVar4);
          local_58 = sVar7;
        }
      }
      pcVar4 = local_40->s;
    }
    else {
      sVar10 = (long)pvVar5 + (1 - (long)pcVar4);
      local_58 = sVar10;
      if (local_48 < (long)sVar10) {
LAB_00372426:
        pcVar4 = "Line too long";
        error_number = 0x54;
LAB_0037243a:
        archive_set_error(&local_50->archive,error_number,pcVar4);
        return -0x1e;
      }
      *unconsumed = sVar10;
      a = local_50;
    }
    if ((long)sVar10 < 1) {
      return -0x1e;
    }
    local_48 = *local_38 - sVar10;
    *local_38 = local_48;
    if (*pcVar4 != '#') {
      lVar9 = 0;
      iStack_60 = -0x14;
      for (; ((iVar8 = iStack_60, 0 < (long)sVar10 &&
              (cVar1 = *pcVar4, iVar8 = lVar9, cVar1 != '\n')) &&
             (iVar8 = -0x14, 0xf5 < (byte)(cVar1 - 0x3aU))); pcVar4 = pcVar4 + 1) {
        lVar3 = 0x7fffffffffffffff;
        if (lVar9 < 0xccccccccccccccd) {
          lVar3 = 0x7fffffffffffffff;
          if (lVar9 != 0xccccccccccccccc || (byte)(cVar1 - 0x30U) < 8) {
            lVar3 = lVar9 * 10 + (ulong)(byte)(cVar1 - 0x30U);
          }
        }
        lVar9 = lVar3;
        sVar10 = sVar10 - 1;
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, size_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}